

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O1

EStatus __thiscall
NFastBernoulli::TBaseSampler::Sample(TBaseSampler *this,TRng *rng,void *ptr,size_t size)

{
  ulong uVar1;
  IExecutor *pIVar2;
  result_type rVar3;
  ulong uVar4;
  EStatus EVar5;
  
  EVar5 = EWrongPtrAlignment;
  if (((ulong)ptr & 0xf) == 0) {
    EVar5 = (uint)((size & 0xf) != 0) * 3;
  }
  if ((((uint)ptr | (uint)size) & 0xf) == 0) {
    EVar5 = EOk;
    uVar1 = (((this->Executor_)._M_t.
              super___uniq_ptr_impl<NFastBernoulli::IExecutor,_std::default_delete<NFastBernoulli::IExecutor>_>
              ._M_t.
              super__Tuple_impl<0UL,_NFastBernoulli::IExecutor_*,_std::default_delete<NFastBernoulli::IExecutor>_>
              .super__Head_base<0UL,_NFastBernoulli::IExecutor_*,_false>._M_head_impl)->Plan_).
            NoSrcBlocks_;
    if (7 < size) {
      uVar4 = 0;
      do {
        rVar3 = std::
                mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                ::operator()(rng);
        *(result_type *)((long)ptr + uVar4) = rVar3;
        uVar4 = uVar4 + 8;
      } while ((size & 0xfffffffffffffff8) != uVar4);
    }
    pIVar2 = (this->Executor_)._M_t.
             super___uniq_ptr_impl<NFastBernoulli::IExecutor,_std::default_delete<NFastBernoulli::IExecutor>_>
             ._M_t.
             super__Tuple_impl<0UL,_NFastBernoulli::IExecutor_*,_std::default_delete<NFastBernoulli::IExecutor>_>
             .super__Head_base<0UL,_NFastBernoulli::IExecutor_*,_false>._M_head_impl;
    (*pIVar2->_vptr_IExecutor[2])(pIVar2,ptr,ptr,size / uVar1 >> 5);
  }
  return EVar5;
}

Assistant:

EStatus TBaseSampler::Sample(TRng &rng, void *ptr, size_t size) noexcept {
    if (auto status = Validate(ptr, size); status) {
        return status;
    }

    size_t noblocks = size / Executor_->Plan().NoSrcBlocks_ / GetBlockSize();
    uint64_t *begin = static_cast<uint64_t *>(ptr);
    uint64_t *end = begin + size / sizeof(uint64_t);

    for (auto it = begin; it != end; ++it) {
        *it = rng();
    }

    Executor_->Execute(ptr, ptr, noblocks);
    return EOk;
}